

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O2

void __thiscall GoniometricLight_Sampling_Test::TestBody(GoniometricLight_Sampling_Test *this)

{
  RGBColorSpace *imageColorSpace;
  int iVar1;
  Allocator AVar2;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  allocator<char> local_511;
  SpectrumHandle local_510;
  SampledWavelengths lambda;
  LightHandle local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  Image image;
  Image local_398;
  GoniometricLight light;
  
  MakeLightImage(&image,(Point2i)0x10000000200);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"R",&local_511);
  requestedChannels.n = 1;
  requestedChannels.ptr = &local_4d0;
  pbrt::Image::GetChannelDesc((ImageChannelDesc *)&lambda,&image,requestedChannels);
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Image::SelectChannels((Image *)&light,&image,(ImageChannelDesc *)&lambda,AVar2);
  pbrt::Image::operator=(&image,(Image *)&light);
  pbrt::Image::~Image((Image *)&light);
  pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
            ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&lambda);
  std::__cxx11::string::~string((string *)&local_4d0);
  if (TestBody()::I == '\0') {
    iVar1 = __cxa_guard_acquire(&TestBody()::I);
    if (iVar1 != 0) {
      TestBody::I.c = 10.0;
      __cxa_guard_release(&TestBody()::I);
    }
  }
  if (TestBody()::id == '\0') {
    iVar1 = __cxa_guard_acquire(&TestBody()::id);
    if (iVar1 != 0) {
      pbrt::Transform::Transform(&TestBody::id);
      __cxa_guard_release(&TestBody()::id);
    }
  }
  lambda.lambda.values[0] = 0.0;
  lambda.lambda.values[1] = 0.0;
  lambda.lambda.values[2] = 0.0;
  lambda.lambda.values[3] = 0.0;
  local_510.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )0x1000003187998;
  pbrt::Image::Image(&local_398,&image);
  imageColorSpace = pbrt::RGBColorSpace::sRGB;
  AVar2.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::GoniometricLight::GoniometricLight
            (&light,&TestBody::id,(MediumInterface *)&lambda,&local_510,1.0,&local_398,
             imageColorSpace,AVar2);
  pbrt::Image::~Image(&local_398);
  pbrt::SampledWavelengths::SampleUniform(&lambda,0.5,360.0,830.0);
  local_4d8.
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
           )((ulong)&light | 0x4000000000000);
  testPhiVsSampled(&local_4d8,&lambda);
  pbrt::GoniometricLight::~GoniometricLight(&light);
  pbrt::Image::~Image(&image);
  return;
}

Assistant:

TEST(GoniometricLight, Sampling) {
    Image image = MakeLightImage({512, 256});
    image = image.SelectChannels(image.GetChannelDesc({"R"}));

    static ConstantSpectrum I(10.);
    static Transform id;
    GoniometricLight light(id, MediumInterface(), &I, 1.f, std::move(image),
                           RGBColorSpace::sRGB, Allocator());
    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    testPhiVsSampled(LightHandle(&light), lambda);
}